

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NodeIsTravIdCurrent(Abc_Obj_t *p)

{
  int iVar1;
  int in_EDX;
  Vec_Int_t *p_00;
  
  p_00 = &p->pNtk->vTravIds;
  iVar1 = p->Id;
  Vec_IntFillExtra(p_00,iVar1 + 1,in_EDX);
  iVar1 = Vec_IntEntry(p_00,iVar1);
  return (int)(iVar1 == p->pNtk->nTravIds);
}

Assistant:

static inline int         Abc_NodeIsTravIdCurrent( Abc_Obj_t * p )          { return (Abc_NodeTravId(p) == Abc_ObjNtk(p)->nTravIds);                                }